

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gzlib.c
# Opt level: O1

void gzclearerr(gzFile file)

{
  if (file != (gzFile)0x0) {
    if (*file != 0x79b1) {
      if (*file != 0x1c4f) {
        return;
      }
      *(undefined4 *)((long)file + 0x3c) = 0;
    }
    if (*(void **)((long)file + 0x70) != (void *)0x0) {
      if (*(int *)((long)file + 0x6c) != -4) {
        free(*(void **)((long)file + 0x70));
      }
      *(undefined8 *)((long)file + 0x70) = 0;
    }
    *(undefined4 *)((long)file + 0x6c) = 0;
  }
  return;
}

Assistant:

void ZEXPORT gzclearerr(gzFile file)
{
    gz_statep state;

    /* get internal structure and check integrity */
    if (file == NULL)
        return;
    state = (gz_statep)file;
    if (state->mode != GZ_READ && state->mode != GZ_WRITE)
        return;

    /* clear error and end-of-file */
    if (state->mode == GZ_READ)
        state->eof = 0;
    gz_error(state, Z_OK, NULL);
}